

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall VoltageDependance::setParameter(VoltageDependance *this,string *name,string *value)

{
  bool bVar1;
  stringstream param;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,(string *)value);
  bVar1 = std::operator==(name,"reversal-potential");
  if (!bVar1) {
    bVar1 = std::operator==(name,"weight");
    if (!bVar1) {
      Parametric::setParameter((Parametric *)this,name,value);
      goto LAB_0013aef4;
    }
  }
  std::istream::_M_extract<double>((double *)local_1a0);
LAB_0013aef4:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void VoltageDependance::setParameter(const string& name, const string& value)
{
	stringstream param;
	param << value;
	
	if (name=="reversal-potential") 
		param >> dReversal;
	else if (name=="weight")
		param >> dWeight;
	else
		StochasticFunction::setParameter(name, value);
}